

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_qpak.c
# Opt level: O3

void * QPAK_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  uint in_EAX;
  int iVar1;
  PHYSFS_uint32 PVar2;
  PHYSFS_uint32 PVar3;
  void *arc;
  PHYSFS_ErrorCode errcode;
  PHYSFS_uint32 val;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs_archiver_qpak.c"
                  ,0x43,"void *QPAK_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = __PHYSFS_readAll(io,(void *)((long)&uStack_28 + 4),4);
    if (iVar1 == 0) {
      return (void *)0x0;
    }
    PVar2 = PHYSFS_swapULE32(uStack_28._4_4_);
    if (PVar2 == 0x4b434150) {
      *claimed = 1;
      iVar1 = __PHYSFS_readAll(io,(void *)((long)&uStack_28 + 4),4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      PVar2 = PHYSFS_swapULE32(uStack_28._4_4_);
      iVar1 = __PHYSFS_readAll(io,(void *)((long)&uStack_28 + 4),4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      PVar3 = PHYSFS_swapULE32(uStack_28._4_4_);
      if ((PVar3 & 0x3f) == 0) {
        iVar1 = (*io->seek)(io,(PHYSFS_uint64)PVar2);
        if (iVar1 == 0) {
          return (void *)0x0;
        }
        arc = UNPK_openArchive(io);
        if (arc == (void *)0x0) {
          return (void *)0x0;
        }
        iVar1 = qpakLoadEntries(io,PVar3 >> 6,arc);
        if (iVar1 == 0) {
          UNPK_abandonArchive(arc);
          return (void *)0x0;
        }
        return arc;
      }
      errcode = PHYSFS_ERR_CORRUPT;
    }
    else {
      errcode = PHYSFS_ERR_UNSUPPORTED;
    }
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *QPAK_openArchive(PHYSFS_Io *io, const char *name,
                              int forWriting, int *claimed)
{
    PHYSFS_uint32 val = 0;
    PHYSFS_uint32 pos = 0;
    PHYSFS_uint32 count = 0;
    void *unpkarc;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &val, 4), NULL);
    if (PHYSFS_swapULE32(val) != QPAK_SIG)
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &val, 4), NULL);
    pos = PHYSFS_swapULE32(val);  /* directory table offset. */

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &val, 4), NULL);
    count = PHYSFS_swapULE32(val);

    /* corrupted archive? */
    BAIL_IF((count % 64) != 0, PHYSFS_ERR_CORRUPT, NULL);
    count /= 64;

    BAIL_IF_ERRPASS(!io->seek(io, pos), NULL);

    unpkarc = UNPK_openArchive(io);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!qpakLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}